

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_write_vec3_float(void *a,float *vertices,uint32_t nr_of_vertices,trico_stream_type st)

{
  uint8_t *puVar1;
  int iVar2;
  size_t __size;
  int iVar3;
  uint64_t sz;
  ulong uVar4;
  uint32_t nr_of_compressed_z_bytes;
  uint32_t nr_of_compressed_y_bytes;
  uint32_t nr_of_compressed_x_bytes;
  uint8_t *compressed_z;
  uint8_t *compressed_y;
  uint8_t *compressed_x;
  float *z;
  float *y;
  float *x;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  iVar2 = buffer_ready_for_writing((trico_archive *)a,1);
  iVar3 = 0;
  if (iVar2 != 0) {
    **(undefined1 **)((long)a + 8) = (char)st;
    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 1;
    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -1;
    iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
    iVar3 = 0;
    if (iVar2 != 0) {
      **(uint32_t **)((long)a + 8) = nr_of_vertices;
      *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
      __size = (ulong)nr_of_vertices << 2;
      local_38 = (float *)malloc(__size);
      local_40 = (float *)malloc(__size);
      local_48 = (float *)malloc(__size);
      trico_transpose_xyz_aos_to_soa(&local_38,&local_40,&local_48,vertices,nr_of_vertices);
      trico_compress(&local_64,&local_50,local_38,nr_of_vertices,4,10);
      free(local_38);
      iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
      puVar1 = local_50;
      iVar3 = 0;
      if (iVar2 != 0) {
        **(uint **)((long)a + 8) = local_64;
        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
        uVar4 = (ulong)local_64;
        iVar2 = buffer_ready_for_writing((trico_archive *)a,uVar4);
        if (iVar2 != 0) {
          memcpy(*(void **)((long)a + 8),puVar1,uVar4);
          *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar4;
          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar4;
          free(local_50);
          trico_compress(&local_68,&local_58,local_40,nr_of_vertices,4,10);
          free(local_40);
          iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
          puVar1 = local_58;
          iVar3 = 0;
          if (iVar2 != 0) {
            **(uint **)((long)a + 8) = local_68;
            *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
            *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
            uVar4 = (ulong)local_68;
            iVar2 = buffer_ready_for_writing((trico_archive *)a,uVar4);
            if (iVar2 != 0) {
              memcpy(*(void **)((long)a + 8),puVar1,uVar4);
              *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar4;
              *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar4;
              free(local_58);
              trico_compress(&local_6c,&local_60,local_48,nr_of_vertices,4,10);
              free(local_48);
              iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
              puVar1 = local_60;
              iVar3 = 0;
              if (iVar2 != 0) {
                **(uint **)((long)a + 8) = local_6c;
                *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                uVar4 = (ulong)local_6c;
                iVar2 = buffer_ready_for_writing((trico_archive *)a,uVar4);
                if (iVar2 != 0) {
                  memcpy(*(void **)((long)a + 8),puVar1,uVar4);
                  *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar4;
                  *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar4;
                  free(local_60);
                  iVar3 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int trico_write_vec3_float(void* a, const float* vertices, uint32_t nr_of_vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);

  uint32_t nr_of_compressed_x_bytes;
  uint8_t* compressed_x;
  trico_compress(&nr_of_compressed_x_bytes, &compressed_x, x, nr_of_vertices, 4, 10);

  trico_free(x);
  if (!write(&nr_of_compressed_x_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_x, 1, nr_of_compressed_x_bytes, arch))
    return 0;
  trico_free(compressed_x);

  uint32_t nr_of_compressed_y_bytes;
  uint8_t* compressed_y;
  trico_compress(&nr_of_compressed_y_bytes, &compressed_y, y, nr_of_vertices, 4, 10);

  trico_free(y);
  if (!write(&nr_of_compressed_y_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_y, 1, nr_of_compressed_y_bytes, arch))
    return 0;
  trico_free(compressed_y);

  uint32_t nr_of_compressed_z_bytes;
  uint8_t* compressed_z;
  trico_compress(&nr_of_compressed_z_bytes, &compressed_z, z, nr_of_vertices, 4, 10);

  trico_free(z);
  if (!write(&nr_of_compressed_z_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_z, 1, nr_of_compressed_z_bytes, arch))
    return 0;
  trico_free(compressed_z);
  return 1;
  }